

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

string * sentencepiece::util::StrError_abi_cxx11_(int errnum)

{
  ostream *poVar1;
  int in_ESI;
  string *in_RDI;
  ostringstream os;
  char *str;
  char buffer [1024];
  int kStrErrorSize;
  ostringstream local_598 [376];
  char *local_420;
  char local_418 [1032];
  undefined4 local_10;
  int local_c;
  
  local_10 = 0x400;
  local_420 = (char *)0x0;
  local_c = in_ESI;
  local_420 = strerror_r(in_ESI,local_418,0x3ff);
  std::__cxx11::ostringstream::ostringstream(local_598);
  poVar1 = std::operator<<((ostream *)local_598,local_420);
  poVar1 = std::operator<<(poVar1," Error #");
  std::ostream::operator<<(poVar1,local_c);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_598);
  return in_RDI;
}

Assistant:

std::string StrError(int errnum) {
  constexpr int kStrErrorSize = 1024;
  char buffer[kStrErrorSize];
  char *str = nullptr;
#if defined(__GLIBC__) && defined(_GNU_SOURCE)
  str = strerror_r(errnum, buffer, kStrErrorSize - 1);
#elif defined(_WIN32)
  strerror_s(buffer, kStrErrorSize - 1, errnum);
  str = buffer;
#else
  strerror_r(errnum, buffer, kStrErrorSize - 1);
  str = buffer;
#endif
  std::ostringstream os;
  os << str << " Error #" << errnum;
  return os.str();
}